

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O1

void __thiscall
OpenMD::Field<OpenMD::Vector3<double>_>::writeField(Field<OpenMD::Vector3<double>_> *this)

{
  long *plVar1;
  pointer pvVar2;
  double dVar3;
  char cVar4;
  ostream *poVar5;
  double (*padVar6) [3];
  uint i;
  long lVar7;
  uint j;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  pointer pcVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  Revision r;
  ofstream fs;
  Mat3x3d hmat;
  Revision local_309;
  string local_308;
  long local_2e0;
  double local_2d8 [4];
  double local_2b8;
  double local_2b0;
  undefined8 local_2a8 [4];
  undefined1 local_288 [16];
  long local_278;
  filebuf local_270 [240];
  ios_base local_180 [264];
  Mat3x3d local_78;
  
  Snapshot::getHmat(&local_78,((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_);
  local_2d8[0] = 0.0;
  local_2d8[1] = 0.0;
  local_2d8[2] = 0.0;
  std::ofstream::ofstream
            (&local_278,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"# ",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_278,
                        (this->super_StaticAnalyser).analysisType_._M_dataplus._M_p,
                        (this->super_StaticAnalyser).analysisType_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_(&local_308,&local_309);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_278,local_308._M_dataplus._M_p,local_308._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"# ",2);
    Revision::getBuildDate_abi_cxx11_(&local_308,&local_309);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_278,local_308._M_dataplus._M_p,local_308._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"# selection script: \"",0x15);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_278,(this->selectionScript_)._M_dataplus._M_p,
                        (this->selectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"#\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,
               "# Vector Field output file format has coordinates of the center\n",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,
               "# of the voxel followed by the value of field (either vector or\n",0x40);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"# scalar).\n",0xb);
    plVar1 = *(long **)&(((this->field_).
                          super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                        )._M_impl.super__Vector_impl_data;
    if (plVar1[1] != *plVar1) {
      local_2e0 = 0;
      uVar9 = 0;
      do {
        auVar13._8_4_ = (int)(uVar9 >> 0x20);
        auVar13._0_8_ = uVar9;
        auVar13._12_4_ = 0x45300000;
        local_2d8[2] = ((auVar13._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) /
                       (double)(this->nBins_).super_Vector<int,_3U>.data_[2] + -0.5;
        pvVar2 = (this->field_).
                 super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pvVar2->
            super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish !=
            (pvVar2->
            super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start) {
          uVar11 = 0;
          do {
            auVar14._8_4_ = (int)(uVar11 >> 0x20);
            auVar14._0_8_ = uVar11;
            auVar14._12_4_ = 0x45300000;
            dVar15 = auVar14._8_8_ - 1.9342813113834067e+25;
            dVar3 = dVar15 + ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
            local_288._8_4_ = SUB84(dVar15,0);
            local_288._0_8_ = dVar3;
            local_288._12_4_ = (int)((ulong)dVar15 >> 0x20);
            local_2d8[1] = dVar3 / (double)(this->nBins_).super_Vector<int,_3U>.data_[1] + -0.5;
            if ((this->field_).
                super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (this->field_).
                super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar10 = 0;
              do {
                local_2d8[1] = (double)local_288._0_8_ /
                               (double)(this->nBins_).super_Vector<int,_3U>.data_[1] + -0.5;
                local_308._M_dataplus._M_p = (char *)0x0;
                local_308._M_string_length = 0;
                local_308.field_2._M_allocated_capacity = 0;
                padVar6 = (double (*) [3])&local_78;
                lVar7 = 0;
                do {
                  pcVar12 = (&local_308._M_dataplus)[lVar7]._M_p;
                  lVar8 = 0;
                  do {
                    pcVar12 = (pointer)((double)pcVar12 +
                                       (((SquareMatrix<double,_3> *)*padVar6)->
                                       super_RectMatrix<double,_3U,_3U>).data_[0][lVar8] *
                                       local_2d8[lVar8]);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 3);
                  (&local_308._M_dataplus)[lVar7]._M_p = pcVar12;
                  lVar7 = lVar7 + 1;
                  padVar6 = padVar6 + 1;
                } while (lVar7 != 3);
                local_2b0 = (double)local_308._M_string_length;
                local_2b8 = (double)local_308.field_2._M_allocated_capacity;
                poVar5 = std::ostream::_M_insert<double>((double)local_308._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
                poVar5 = std::ostream::_M_insert<double>(local_2b0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
                poVar5 = std::ostream::_M_insert<double>(local_2b8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
                lVar7 = *(long *)(*(long *)&(this->field_).
                                            super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                            super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data + uVar11 * 0x18);
                local_2a8[0] = 0;
                local_2a8[1] = 0;
                local_2a8[2] = 0;
                if (local_2a8 != (undefined8 *)(lVar7 + uVar9 * 0x18)) {
                  lVar8 = 0;
                  do {
                    local_2a8[lVar8] = *(undefined8 *)(lVar7 + local_2e0 + lVar8 * 8);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 3);
                }
                (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[8])(&local_308,this,local_2a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_278,local_308._M_dataplus._M_p,
                           local_308._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p != &local_308.field_2) {
                  operator_delete(local_308._M_dataplus._M_p,
                                  local_308.field_2._M_allocated_capacity + 1);
                }
                cVar4 = (char)(ostream *)&local_278;
                std::ios::widen((char)*(undefined8 *)(local_278 + -0x18) + cVar4);
                std::ostream::put(cVar4);
                std::ostream::flush();
                uVar10 = uVar10 + 1;
              } while (uVar10 < (ulong)(((long)(this->field_).
                                               super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->field_).
                                               super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                       -0x5555555555555555));
            }
            pvVar2 = (this->field_).
                     super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar11 = uVar11 + 1;
          } while (uVar11 < (ulong)(((long)(pvVar2->
                                           super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     *(long *)&(pvVar2->
                                               super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                                               )._M_impl.super__Vector_impl_data >> 3) *
                                   -0x5555555555555555));
        }
        uVar9 = uVar9 + 1;
        plVar1 = *(long **)&(((this->field_).
                              super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                            )._M_impl.super__Vector_impl_data;
        local_2e0 = local_2e0 + 0x18;
      } while (uVar9 < (ulong)((plVar1[1] - *plVar1 >> 3) * -0x5555555555555555));
    }
  }
  local_278 = _VTT;
  *(undefined8 *)(local_270 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_270);
  std::ios_base::~ios_base(local_180);
  return;
}

Assistant:

void Field<T>::writeField() {
    Mat3x3d hmat = info_->getSnapshotManager()->getCurrentSnapshot()->getHmat();
    Vector3d scaled(0.0);

    std::ofstream fs(outputFilename_.c_str());
    if (fs.is_open()) {
      Revision r;
      fs << "# " << getAnalysisType() << "\n";
      fs << "# OpenMD " << r.getFullRevision() << "\n";
      fs << "# " << r.getBuildDate() << "\n";
      fs << "# selection script: \"" << selectionScript_ << "\"\n";
      fs << "#\n";
      fs << "# Vector Field output file format has coordinates of the center\n";
      fs << "# of the voxel followed by the value of field (either vector or\n";
      fs << "# scalar).\n";

      for (std::size_t k = 0; k < field_[0][0].size(); ++k) {
        scaled.z() = RealType(k) / nBins_.z() - 0.5;
        for (std::size_t j = 0; j < field_[0].size(); ++j) {
          scaled.y() = RealType(j) / nBins_.y() - 0.5;
          for (std::size_t i = 0; i < field_.size(); ++i) {
            scaled.y() = RealType(j) / nBins_.y() - 0.5;

            Vector3d voxelLoc = hmat * scaled;

            fs << voxelLoc.x() << "\t";
            fs << voxelLoc.y() << "\t";
            fs << voxelLoc.z() << "\t";

            fs << writeValue(field_[i][j][k]);

            fs << std::endl;
          }
        }
      }
    }
  }